

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_soc(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,
                          opj_event_mgr_t *p_manager)

{
  OPJ_BYTE *p_buffer;
  OPJ_SIZE_T OVar1;
  OPJ_BYTE *l_start_stream;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x73c,
                  "OPJ_BOOL opj_j2k_write_soc(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      p_buffer = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
      opj_write_bytes_LE(p_buffer,0xff4f,2);
      OVar1 = opj_stream_write_data(p_stream,p_buffer,2,p_manager);
      p_j2k_local._4_4_ = (uint)(OVar1 == 2);
      return p_j2k_local._4_4_;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x73e,
                  "OPJ_BOOL opj_j2k_write_soc(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x73d,
                "OPJ_BOOL opj_j2k_write_soc(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_soc(opj_j2k_t *p_j2k,
                                  opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager)
{
    /* 2 bytes will be written */
    OPJ_BYTE * l_start_stream = 00;

    /* preconditions */
    assert(p_stream != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_start_stream = p_j2k->m_specific_param.m_encoder.m_header_tile_data;

    /* write SOC identifier */
    opj_write_bytes(l_start_stream, J2K_MS_SOC, 2);

    if (opj_stream_write_data(p_stream, l_start_stream, 2, p_manager) != 2) {
        return OPJ_FALSE;
    }

    /* UniPG>> */
#ifdef USE_JPWL
    /* update markers struct */
    /*
            OPJ_BOOL res = j2k_add_marker(p_j2k->cstr_info, J2K_MS_SOC, p_stream_tell(p_stream) - 2, 2);
    */
    assert(0 && "TODO");
#endif /* USE_JPWL */
    /* <<UniPG */

    return OPJ_TRUE;
}